

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

void __thiscall Fad<float>::Fad(Fad<float> *this,int sz,int i,float *x)

{
  float *pfVar1;
  float *pfVar2;
  
  this->val_ = *x;
  (this->dx_).ptr_to_data = (float *)0x0;
  (this->dx_).num_elts = sz;
  pfVar1 = (float *)operator_new__((ulong)(uint)sz * 4);
  (this->dx_).ptr_to_data = pfVar1;
  pfVar2 = pfVar1 + (uint)sz;
  do {
    pfVar2[-1] = 0.0;
    pfVar2 = pfVar2 + -1;
  } while (pfVar1 < pfVar2);
  this->defaultVal = 0.0;
  pfVar1[i] = 1.0;
  return;
}

Assistant:

Fad(const int sz, const int i, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0))
    {dx_[i]=1.;}